

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateTables(FileGenerator *this,Printer *printer)

{
  int iVar1;
  LogMessage *pLVar2;
  pointer puVar3;
  pointer puVar4;
  size_t aux_offset;
  long lVar5;
  size_t offset;
  ulong uVar6;
  bool bVar7;
  int idx;
  size_t value_1;
  Formatter format;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  calculated_order;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aux_entries;
  vector<unsigned_long,_std::allocator<unsigned_long>_> entries;
  int local_120;
  int local_11c;
  void *local_118;
  iterator iStack_110;
  int *local_108;
  Formatter local_100;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_c8;
  undefined1 local_a8 [16];
  unsigned_long *local_98;
  undefined1 local_68 [16];
  unsigned_long *local_58;
  
  local_100.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_100.vars_._M_t,&(this->variables_)._M_t);
  if ((this->options_).table_driven_parsing != true) goto LAB_0029ad5e;
  Formatter::operator()<>
            (&local_100,
             "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTableField\n    const $tablename$::entries[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
            );
  io::Printer::Indent(local_100.printer_);
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = (unsigned_long *)0x0;
  local_58 = (unsigned_long *)0x0;
  puVar3 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == puVar3) {
    bVar7 = true;
  }
  else {
    uVar6 = 0;
    lVar5 = 0;
    do {
      local_a8._0_8_ =
           MessageGenerator::GenerateParseOffsets
                     (puVar3[uVar6]._M_t.
                      super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                      .
                      super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                      ._M_head_impl,printer);
      if ((unsigned_long *)local_68._8_8_ == local_58) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_68,
                   (iterator)local_68._8_8_,(unsigned_long *)local_a8);
      }
      else {
        *(undefined8 *)local_68._8_8_ = local_a8._0_8_;
        local_68._8_8_ = local_68._8_8_ + 8;
      }
      lVar5 = lVar5 + local_a8._0_8_;
      uVar6 = uVar6 + 1;
      puVar3 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
    bVar7 = lVar5 == 0;
  }
  if (bVar7) {
    Formatter::operator()<>(&local_100,"{0, 0, 0, ::$proto_ns$::internal::kInvalidMask, 0, 0},\n");
  }
  io::Printer::Outdent(local_100.printer_);
  Formatter::operator()<>
            (&local_100,
             "};\n\nPROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::AuxiliaryParseTableField\n    const $tablename$::aux[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
            );
  io::Printer::Indent(local_100.printer_);
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_8_ = (unsigned_long *)0x0;
  local_98 = (unsigned_long *)0x0;
  puVar3 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == puVar3) {
LAB_0029ac69:
    Formatter::operator()<>(&local_100,"::$proto_ns$::internal::AuxiliaryParseTableField(),\n");
  }
  else {
    uVar6 = 0;
    lVar5 = 0;
    do {
      local_118 = (void *)MessageGenerator::GenerateParseAuxTable
                                    (puVar3[uVar6]._M_t.
                                     super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                                     .
                                     super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                                     ._M_head_impl,printer);
      if ((unsigned_long *)local_a8._8_8_ == local_98) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_a8,
                   (iterator)local_a8._8_8_,(unsigned_long *)&local_118);
      }
      else {
        *(void **)local_a8._8_8_ = local_118;
        local_a8._8_8_ = local_a8._8_8_ + 8;
      }
      lVar5 = lVar5 + (long)local_118;
      uVar6 = uVar6 + 1;
      puVar3 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
    if (lVar5 == 0) goto LAB_0029ac69;
  }
  io::Printer::Outdent(local_100.printer_);
  Formatter::operator()<>
            (&local_100,
             "};\nPROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTable const\n    $tablename$::schema[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
            );
  io::Printer::Indent(local_100.printer_);
  puVar3 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar3) {
    uVar6 = 0;
    aux_offset = 0;
    offset = 0;
    do {
      MessageGenerator::GenerateParseTable
                (puVar3[uVar6]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>.
                 _M_head_impl,printer,offset,aux_offset);
      offset = offset + *(long *)(local_68._0_8_ + uVar6 * 8);
      aux_offset = aux_offset + *(long *)(local_a8._0_8_ + uVar6 * 8);
      uVar6 = uVar6 + 1;
      puVar3 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar6 < (ulong)((long)puVar4 - (long)puVar3 >> 3));
  }
  if (puVar3 == puVar4) {
    Formatter::operator()<>(&local_100,"{ nullptr, nullptr, 0, -1, -1, false },\n");
  }
  io::Printer::Outdent(local_100.printer_);
  Formatter::operator()<>(&local_100,"};\n\n");
  if ((void *)local_a8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((void *)local_68._0_8_ != (void *)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
LAB_0029ad5e:
  if (((this->message_generators_).
       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->message_generators_).
       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->options_).table_driven_serialization == true)) {
    Formatter::operator()<>
              (&local_100,
               "const ::$proto_ns$::internal::FieldMetadata $tablename$::field_metadata[] = {\n");
    io::Printer::Indent(local_100.printer_);
    local_118 = (void *)0x0;
    iStack_110._M_current = (int *)0x0;
    local_108 = (int *)0x0;
    local_120 = 0;
    if ((this->message_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->message_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        if (iStack_110._M_current == local_108) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_118,iStack_110,&local_120);
        }
        else {
          *iStack_110._M_current = local_120;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
        iVar1 = MessageGenerator::GenerateFieldMetadata
                          ((MessageGenerator *)
                           (this->message_generators_).
                           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                           super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                           ._M_t,printer);
        local_120 = local_120 + iVar1;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)(this->message_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->message_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (iStack_110._M_current == local_108) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_118,iStack_110,&local_120);
    }
    else {
      *iStack_110._M_current = local_120;
      iStack_110._M_current = iStack_110._M_current + 1;
    }
    io::Printer::Outdent(local_100.printer_);
    Formatter::operator()<>
              (&local_100,
               "};\nconst ::$proto_ns$::internal::SerializationTable $tablename$::serialization_table[] = {\n"
              );
    io::Printer::Indent(local_100.printer_);
    local_c8.
    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FlattenMessagesInFile(this->file_,&local_c8);
    if ((long)local_c8.
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_c8.
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)(this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                 ,999);
      pLVar2 = internal::LogMessage::operator<<
                         ((LogMessage *)local_68,
                          "CHECK failed: (calculated_order.size()) == (message_generators_.size()): "
                         );
      internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
    puVar3 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->message_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        if (*(long *)((long)local_c8.
                            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar5 * 2) !=
            **(long **)((long)&(puVar3->_M_t).
                               super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                               .
                               super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                               ._M_head_impl + lVar5 * 2)) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                     ,0x3e9);
          pLVar2 = internal::LogMessage::operator<<
                             ((LogMessage *)local_a8,
                              "CHECK failed: (calculated_order[i]) == (message_generators_[i]->descriptor_): "
                             );
          internal::LogFinisher::operator=((LogFinisher *)&local_11c,pLVar2);
          internal::LogMessage::~LogMessage((LogMessage *)local_a8);
        }
        local_11c = *(int *)((long)local_118 + lVar5 + 4) - *(int *)((long)local_118 + lVar5);
        Formatter::operator()
                  (&local_100,"{$1$, $tablename$::field_metadata + $2$},\n",&local_11c,
                   (int *)((long)local_118 + lVar5));
        uVar6 = uVar6 + 1;
        puVar3 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 4;
      } while (uVar6 < (ulong)((long)(this->message_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)
              );
    }
    io::Printer::Outdent(local_100.printer_);
    Formatter::operator()<>(&local_100,"};\n\n");
    if (local_c8.
        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_118 != (void *)0x0) {
      operator_delete(local_118);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_100.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateTables(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (options_.table_driven_parsing) {
    // TODO(ckennelly): Gate this with the same options flag to enable
    // table-driven parsing.
    format(
        "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTableField\n"
        "    const $tablename$::entries[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    std::vector<size_t> entries;
    size_t count = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      size_t value = message_generators_[i]->GenerateParseOffsets(printer);
      entries.push_back(value);
      count += value;
    }

    // We need these arrays to exist, and MSVC does not like empty arrays.
    if (count == 0) {
      format("{0, 0, 0, ::$proto_ns$::internal::kInvalidMask, 0, 0},\n");
    }

    format.Outdent();
    format(
        "};\n"
        "\n"
        "PROTOBUF_CONSTEXPR_VAR "
        "::$proto_ns$::internal::AuxiliaryParseTableField\n"
        "    const $tablename$::aux[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    std::vector<size_t> aux_entries;
    count = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      size_t value = message_generators_[i]->GenerateParseAuxTable(printer);
      aux_entries.push_back(value);
      count += value;
    }

    if (count == 0) {
      format("::$proto_ns$::internal::AuxiliaryParseTableField(),\n");
    }

    format.Outdent();
    format(
        "};\n"
        "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTable const\n"
        "    $tablename$::schema[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    size_t offset = 0;
    size_t aux_offset = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      message_generators_[i]->GenerateParseTable(printer, offset, aux_offset);
      offset += entries[i];
      aux_offset += aux_entries[i];
    }

    if (message_generators_.empty()) {
      format("{ nullptr, nullptr, 0, -1, -1, false },\n");
    }

    format.Outdent();
    format(
        "};\n"
        "\n");
  }

  if (!message_generators_.empty() && options_.table_driven_serialization) {
    format(
        "const ::$proto_ns$::internal::FieldMetadata "
        "$tablename$::field_metadata[] "
        "= {\n");
    format.Indent();
    std::vector<int> field_metadata_offsets;
    int idx = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      field_metadata_offsets.push_back(idx);
      idx += message_generators_[i]->GenerateFieldMetadata(printer);
    }
    field_metadata_offsets.push_back(idx);
    format.Outdent();
    format(
        "};\n"
        "const ::$proto_ns$::internal::SerializationTable "
        "$tablename$::serialization_table[] = {\n");
    format.Indent();
    // We rely on the order we layout the tables to match the order we
    // calculate them with FlattenMessagesInFile, so we check here that
    // these match exactly.
    std::vector<const Descriptor*> calculated_order =
        FlattenMessagesInFile(file_);
    GOOGLE_CHECK_EQ(calculated_order.size(), message_generators_.size());
    for (int i = 0; i < message_generators_.size(); i++) {
      GOOGLE_CHECK_EQ(calculated_order[i], message_generators_[i]->descriptor_);
      format("{$1$, $tablename$::field_metadata + $2$},\n",
             field_metadata_offsets[i + 1] - field_metadata_offsets[i],  // 1
             field_metadata_offsets[i]);                                 // 2
    }
    format.Outdent();
    format(
        "};\n"
        "\n");
  }
}